

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3Appendf(int *pRc,char **pz,char *zFormat,...)

{
  long lVar1;
  char *in_RCX;
  long *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  char *z2;
  char *z;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff08;
  char *local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI == 0) {
    local_48 = sqlite3_vmprintf(in_RCX,in_stack_ffffffffffffff08);
    if ((local_48 != (char *)0x0) && (*in_RSI != 0)) {
      local_48 = sqlite3_mprintf("%s%s",*in_RSI,local_48);
      sqlite3_free((void *)0x24a9f0);
    }
    if (local_48 == (char *)0x0) {
      *in_RDI = 7;
    }
    sqlite3_free((void *)0x24aa29);
    *in_RSI = (long)local_48;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3Appendf(
  int *pRc,                       /* IN/OUT: Error code */
  char **pz,                      /* IN/OUT: Pointer to string buffer */
  const char *zFormat,            /* Printf format string to append */
  ...                             /* Arguments for printf format string */
){
  if( *pRc==SQLITE_OK ){
    va_list ap;
    char *z;
    va_start(ap, zFormat);
    z = sqlite3_vmprintf(zFormat, ap);
    va_end(ap);
    if( z && *pz ){
      char *z2 = sqlite3_mprintf("%s%s", *pz, z);
      sqlite3_free(z);
      z = z2;
    }
    if( z==0 ) *pRc = SQLITE_NOMEM;
    sqlite3_free(*pz);
    *pz = z;
  }
}